

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.h
# Opt level: O0

void block_write_file<unsigned_char,r_file>(uchar *p,size_t size,r_file *f,size_t blockSize)

{
  FILE *pFVar1;
  size_t sVar2;
  runtime_error *prVar3;
  uint8_t *local_70;
  ulong local_68;
  size_t bytesWritten;
  size_t blocksWritten;
  uint8_t *writeHead;
  size_t remainder;
  size_t blocks;
  size_t blockSize_local;
  r_file *f_local;
  size_t size_local;
  uchar *p_local;
  
  if (size < blockSize) {
    local_68 = 0;
  }
  else {
    local_68 = size / blockSize;
  }
  remainder = local_68;
  local_70 = (uint8_t *)size;
  if (blockSize <= size) {
    local_70 = (uint8_t *)(size % blockSize);
  }
  writeHead = local_70;
  blocksWritten = (size_t)p;
  while( true ) {
    if (remainder == 0) {
      while( true ) {
        if (writeHead == (uint8_t *)0x0) {
          return;
        }
        pFVar1 = (FILE *)r_file::operator_cast_to__IO_FILE_(f);
        sVar2 = fwrite((void *)blocksWritten,1,(size_t)writeHead,pFVar1);
        if (sVar2 == 0) break;
        writeHead = writeHead + -sVar2;
        blocksWritten = sVar2 + blocksWritten;
      }
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"Could not write to file.");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pFVar1 = (FILE *)r_file::operator_cast_to__IO_FILE_(f);
    sVar2 = fwrite((void *)blocksWritten,blockSize,remainder,pFVar1);
    if (sVar2 == 0) break;
    remainder = remainder - sVar2;
    blocksWritten = sVar2 * blockSize + blocksWritten;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,"Unable to write to file.");
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void block_write_file(const T* p, size_t size, const F& f, size_t blockSize = 4096)
{
    size_t blocks = (size >= blockSize)?size / blockSize:0;
    size_t remainder = (size >= blockSize)?size % blockSize:size;
    const uint8_t* writeHead = (const uint8_t*)p;

    while(blocks > 0)
    {
        auto blocksWritten = fwrite((void*)writeHead, blockSize, blocks, f);
        if(blocksWritten == 0)
            throw std::runtime_error("Unable to write to file.");
        blocks -= blocksWritten;
        writeHead += (blocksWritten * blockSize);
    }

    while(remainder > 0)
    {
        auto bytesWritten = fwrite((void*)writeHead, 1, remainder, f);
        if(bytesWritten == 0)
            throw std::runtime_error("Could not write to file.");
        remainder -= bytesWritten;
        writeHead += bytesWritten;
    }
}